

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adjacency_subgraph.cpp
# Opt level: O0

void __thiscall Adjacency_Subgraph_swap_Test::TestBody(Adjacency_Subgraph_swap_Test *this)

{
  allocator<unsigned_long> *paVar1;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  AssertHelper local_548;
  Message local_540;
  int local_534;
  size_t local_530;
  size_t local_528;
  undefined1 local_520 [8];
  AssertionResult gtest_ar_12;
  Message local_508;
  int local_4fc;
  size_t local_4f8;
  size_t local_4f0;
  undefined1 local_4e8 [8];
  AssertionResult gtest_ar_11;
  Message local_4d0;
  int local_4c4;
  size_t local_4c0;
  size_t local_4b8;
  undefined1 local_4b0 [8];
  AssertionResult gtest_ar_10;
  Message local_498;
  int local_48c;
  size_t local_488;
  size_t local_480;
  undefined1 local_478 [8];
  AssertionResult gtest_ar_9;
  Message local_460;
  int local_454;
  size_t local_450;
  size_t local_448;
  undefined1 local_440 [8];
  AssertionResult gtest_ar_8;
  Message local_428;
  int local_41c;
  size_t local_418;
  undefined1 local_410 [8];
  AssertionResult gtest_ar_7;
  Message local_3f8;
  int local_3ec;
  size_t local_3e8;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_3b0;
  Message local_3a8;
  bool local_399;
  undefined1 local_398 [8];
  AssertionResult gtest_ar__1;
  Message local_380;
  int local_374;
  size_t local_370;
  size_t local_368;
  undefined1 local_360 [8];
  AssertionResult gtest_ar_5;
  Message local_348;
  int local_33c;
  size_t local_338;
  size_t local_330;
  undefined1 local_328 [8];
  AssertionResult gtest_ar_4;
  Message local_310;
  int local_304;
  size_t local_300;
  size_t local_2f8;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar_3;
  Message local_2d8;
  int local_2cc;
  size_t local_2c8;
  size_t local_2c0;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_2;
  Message local_2a0;
  int local_294;
  size_t local_290;
  undefined1 local_288 [8];
  AssertionResult gtest_ar_1;
  Message local_270;
  int local_264;
  size_t local_260;
  undefined1 local_258 [8];
  AssertionResult gtest_ar;
  AssertHelper local_228;
  Message local_220;
  bool local_211;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_;
  unsigned_long local_1f8 [5];
  iterator local_1d0;
  size_type local_1c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1c0;
  undefined1 local_1a8 [8];
  Adjacency_Subgraph subgraph_1;
  unsigned_long local_138 [5];
  iterator local_110;
  size_type local_108;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_100;
  undefined1 local_e8 [8];
  Adjacency_Subgraph subgraph_0;
  undefined1 local_70 [8];
  Adjacency_Graph<false> graph_1;
  Adjacency_Graph<false> graph_0;
  Adjacency_Subgraph_swap_Test *this_local;
  
  Disa::create_graph_saad();
  Disa::create_graph_structured<false>((Adjacency_Graph<false> *)local_70,3);
  local_138[2] = 8;
  local_138[3] = 1;
  local_138[0] = 0;
  local_138[1] = 6;
  local_138[4] = 7;
  local_110 = local_138;
  local_108 = 5;
  paVar1 = (allocator<unsigned_long> *)
           ((long)&subgraph_1.level_set_value.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_long>::allocator(paVar1);
  __l_00._M_len = local_108;
  __l_00._M_array = local_110;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_100,__l_00,paVar1);
  Disa::Adjacency_Subgraph::Adjacency_Subgraph
            ((Adjacency_Subgraph *)local_e8,
             (Adjacency_Graph<false> *)
             &graph_1.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_100,0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_100);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)
             ((long)&subgraph_1.level_set_value.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_1f8[2] = 7;
  local_1f8[3] = 8;
  local_1f8[0] = 4;
  local_1f8[1] = 5;
  local_1d0 = local_1f8;
  local_1c8 = 4;
  paVar1 = (allocator<unsigned_long> *)
           ((long)&gtest_ar_.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7);
  std::allocator<unsigned_long>::allocator(paVar1);
  __l._M_len = local_1c8;
  __l._M_array = local_1d0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_1c0,__l,paVar1);
  Disa::Adjacency_Subgraph::Adjacency_Subgraph
            ((Adjacency_Subgraph *)local_1a8,(Adjacency_Graph<false> *)local_70,&local_1c0,0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_1c0);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)
             ((long)&gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  Disa::Adjacency_Subgraph::swap((Adjacency_Subgraph *)local_e8,(Adjacency_Subgraph *)local_1a8);
  local_211 = Disa::Adjacency_Subgraph::is_parent
                        ((Adjacency_Subgraph *)local_e8,(Adjacency_Graph<false> *)local_70);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_210,&local_211,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar2) {
    testing::Message::Message(&local_220);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_210,
               (AssertionResult *)"subgraph_0.is_parent(graph_1)","false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x10d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_228,&local_220);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  local_260 = Disa::Adjacency_Subgraph::size_vertex((Adjacency_Subgraph *)local_e8);
  local_264 = 4;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_258,"subgraph_0.size_vertex()","4",&local_260,&local_264);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
  if (!bVar2) {
    testing::Message::Message(&local_270);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_258);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x10e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  local_290 = Disa::Adjacency_Subgraph::size_edge((Adjacency_Subgraph *)local_e8);
  local_294 = 4;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_288,"subgraph_0.size_edge()","4",&local_290,&local_294);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar2) {
    testing::Message::Message(&local_2a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_288);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x10f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_2a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_2a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  local_2c8 = 0;
  local_2c0 = Disa::Adjacency_Subgraph::local_global((Adjacency_Subgraph *)local_e8,&local_2c8);
  local_2cc = 4;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_2b8,"subgraph_0.local_global(0)","4",&local_2c0,&local_2cc);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
  if (!bVar2) {
    testing::Message::Message(&local_2d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x110,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_2d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
  local_300 = 1;
  local_2f8 = Disa::Adjacency_Subgraph::local_global((Adjacency_Subgraph *)local_e8,&local_300);
  local_304 = 5;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_2f0,"subgraph_0.local_global(1)","5",&local_2f8,&local_304);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
  if (!bVar2) {
    testing::Message::Message(&local_310);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x111,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_310);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
  local_338 = 2;
  local_330 = Disa::Adjacency_Subgraph::local_global((Adjacency_Subgraph *)local_e8,&local_338);
  local_33c = 7;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_328,"subgraph_0.local_global(2)","7",&local_330,&local_33c);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
  if (!bVar2) {
    testing::Message::Message(&local_348);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_328);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x112,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_348);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_348);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
  local_370 = 3;
  local_368 = Disa::Adjacency_Subgraph::local_global((Adjacency_Subgraph *)local_e8,&local_370);
  local_374 = 8;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_360,"subgraph_0.local_global(3)","8",&local_368,&local_374);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
  if (!bVar2) {
    testing::Message::Message(&local_380);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_360);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x113,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_380);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_380);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
  local_399 = Disa::Adjacency_Subgraph::is_parent
                        ((Adjacency_Subgraph *)local_1a8,
                         (Adjacency_Graph<false> *)
                         &graph_1.offset.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_398,&local_399,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_398);
  if (!bVar2) {
    testing::Message::Message(&local_3a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_6.message_,(internal *)local_398,
               (AssertionResult *)"subgraph_1.is_parent(graph_0)","false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_6.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x115,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3b0,&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    std::__cxx11::string::~string((string *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_3a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
  local_3e8 = Disa::Adjacency_Subgraph::size_vertex((Adjacency_Subgraph *)local_1a8);
  local_3ec = 5;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_3e0,"subgraph_1.size_vertex()","5",&local_3e8,&local_3ec);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e0);
  if (!bVar2) {
    testing::Message::Message(&local_3f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x116,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_3f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_3f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
  local_418 = Disa::Adjacency_Subgraph::size_edge((Adjacency_Subgraph *)local_1a8);
  local_41c = 7;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_410,"subgraph_1.size_edge()","7",&local_418,&local_41c);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
  if (!bVar2) {
    testing::Message::Message(&local_428);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_410);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x117,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_428);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_428);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
  local_450 = 0;
  local_448 = Disa::Adjacency_Subgraph::local_global((Adjacency_Subgraph *)local_1a8,&local_450);
  local_454 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_440,"subgraph_1.local_global(0)","0",&local_448,&local_454);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_440);
  if (!bVar2) {
    testing::Message::Message(&local_460);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_440);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x118,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_460);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_460);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_440);
  local_488 = 1;
  local_480 = Disa::Adjacency_Subgraph::local_global((Adjacency_Subgraph *)local_1a8,&local_488);
  local_48c = 6;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_478,"subgraph_1.local_global(1)","6",&local_480,&local_48c);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_478);
  if (!bVar2) {
    testing::Message::Message(&local_498);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_478);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x119,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_498);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_498);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_478);
  local_4c0 = 2;
  local_4b8 = Disa::Adjacency_Subgraph::local_global((Adjacency_Subgraph *)local_1a8,&local_4c0);
  local_4c4 = 8;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_4b0,"subgraph_1.local_global(2)","8",&local_4b8,&local_4c4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b0);
  if (!bVar2) {
    testing::Message::Message(&local_4d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x11a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_4d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_4d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b0);
  local_4f8 = 3;
  local_4f0 = Disa::Adjacency_Subgraph::local_global((Adjacency_Subgraph *)local_1a8,&local_4f8);
  local_4fc = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_4e8,"subgraph_1.local_global(3)","1",&local_4f0,&local_4fc);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e8);
  if (!bVar2) {
    testing::Message::Message(&local_508);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x11b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_508);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_508);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e8);
  local_530 = 4;
  local_528 = Disa::Adjacency_Subgraph::local_global((Adjacency_Subgraph *)local_1a8,&local_530);
  local_534 = 7;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_520,"subgraph_1.local_global(4)","7",&local_528,&local_534);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_520);
  if (!bVar2) {
    testing::Message::Message(&local_540);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_520);
    testing::internal::AssertHelper::AssertHelper
              (&local_548,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x11c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_548,&local_540);
    testing::internal::AssertHelper::~AssertHelper(&local_548);
    testing::Message::~Message(&local_540);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_520);
  Disa::Adjacency_Subgraph::~Adjacency_Subgraph((Adjacency_Subgraph *)local_1a8);
  Disa::Adjacency_Subgraph::~Adjacency_Subgraph((Adjacency_Subgraph *)local_e8);
  Disa::Adjacency_Graph<false>::~Adjacency_Graph((Adjacency_Graph<false> *)local_70);
  Disa::Adjacency_Graph<false>::~Adjacency_Graph
            ((Adjacency_Graph<false> *)
             &graph_1.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(Adjacency_Subgraph, swap) {
  Adjacency_Graph<false> graph_0 = create_graph_saad();
  Adjacency_Graph<false> graph_1 = create_graph_structured<false>(3);
  Adjacency_Subgraph subgraph_0(graph_0, {0, 6, 8, 1, 7});
  Adjacency_Subgraph subgraph_1(graph_1, {4, 5, 7, 8});

  subgraph_0.swap(subgraph_1);
  EXPECT_TRUE(subgraph_0.is_parent(graph_1));
  EXPECT_EQ(subgraph_0.size_vertex(), 4);
  EXPECT_EQ(subgraph_0.size_edge(), 4);
  EXPECT_EQ(subgraph_0.local_global(0), 4);
  EXPECT_EQ(subgraph_0.local_global(1), 5);
  EXPECT_EQ(subgraph_0.local_global(2), 7);
  EXPECT_EQ(subgraph_0.local_global(3), 8);

  EXPECT_TRUE(subgraph_1.is_parent(graph_0));
  EXPECT_EQ(subgraph_1.size_vertex(), 5);
  EXPECT_EQ(subgraph_1.size_edge(), 7);
  EXPECT_EQ(subgraph_1.local_global(0), 0);
  EXPECT_EQ(subgraph_1.local_global(1), 6);
  EXPECT_EQ(subgraph_1.local_global(2), 8);
  EXPECT_EQ(subgraph_1.local_global(3), 1);
  EXPECT_EQ(subgraph_1.local_global(4), 7);
}